

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.h
# Opt level: O3

int __thiscall CVmDbgFramePtr::is_nested_in(CVmDbgFramePtr *this,CVmDbgTablePtr *dp,int i)

{
  ushort uVar1;
  uchar *puVar2;
  long lVar3;
  bool bVar4;
  
  uVar1 = *(ushort *)this->p_;
  bVar4 = uVar1 != 0;
  if ((uint)uVar1 != i && bVar4) {
    puVar2 = dp->p_;
    lVar3 = *(ushort *)(puVar2 + G_dbg_hdr_size_X) * G_line_entry_size_X + G_dbg_hdr_size_X + 4;
    do {
      uVar1 = *(ushort *)
               (puVar2 + (ulong)*(ushort *)(puVar2 + (ulong)uVar1 * 2 + lVar3) +
                         (ulong)uVar1 * 2 + lVar3);
      bVar4 = uVar1 != 0;
      if ((uint)uVar1 == i) break;
    } while (uVar1 != 0);
  }
  return (int)bVar4;
}

Assistant:

uint get_enclosing_frame() const { return osrp2(p_); }